

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O1

void __thiscall libDAI::JTree::JTree(JTree *this,FactorGraph *fg,Properties *opts,bool automatic)

{
  FactorGraph *this_00;
  pointer pVVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined4 extraout_var_01;
  value_type *__x;
  undefined4 extraout_var_02;
  ostream *poVar6;
  undefined4 extraout_var_03;
  ClusterGraph *pCVar7;
  undefined4 extraout_var_04;
  Exception *pEVar8;
  Var *n;
  size_t I;
  ulong uVar9;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> ElimVec;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> cl;
  ClusterGraph _cg;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> local_290;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> local_278;
  ClusterGraph local_260;
  undefined1 local_1d0 [48];
  pointer local_1a0;
  pointer local_190;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_188;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_170;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_158 [4];
  pointer local_f0;
  pointer pFStack_e8;
  pointer pFStack_e0;
  pointer pRStack_d8;
  pointer pRStack_d0;
  pointer pRStack_c8;
  pointer ppStack_c0;
  pointer ppStack_b8;
  pointer local_b0;
  pointer pvStack_a8;
  pointer pvStack_a0;
  pointer pvStack_98;
  pointer pvStack_90;
  pointer pvStack_88;
  pointer pvStack_80;
  pointer pvStack_78;
  pointer local_70;
  pointer pvStack_68;
  _Rb_tree_impl<std::less<unsigned_long>,_true> _Stack_60;
  
  this_00 = (FactorGraph *)(local_1d0 + 0x10);
  local_1d0._8_4_ = NORMPROB;
  local_1d0._0_8_ = &PTR__RegionGraph_005e8030;
  FactorGraph::FactorGraph(this_00,fg);
  _Stack_60.super__Rb_tree_header._M_header._M_left = &_Stack_60.super__Rb_tree_header._M_header;
  local_70 = (pointer)0x0;
  pvStack_68 = (pointer)0x0;
  _Stack_60._0_8_ = 0;
  _Stack_60.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_60.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_60.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0 = (pointer)0x0;
  pvStack_a8 = (pointer)0x0;
  pvStack_a0 = (pointer)0x0;
  pvStack_98 = (pointer)0x0;
  pvStack_90 = (pointer)0x0;
  pvStack_88 = (pointer)0x0;
  pvStack_80 = (pointer)0x0;
  pvStack_78 = (pointer)0x0;
  local_f0 = (pointer)0x0;
  pFStack_e8 = (pointer)0x0;
  pFStack_e0 = (pointer)0x0;
  pRStack_d8 = (pointer)0x0;
  pRStack_d0 = (pointer)0x0;
  pRStack_c8 = (pointer)0x0;
  ppStack_c0 = (pointer)0x0;
  ppStack_b8 = (pointer)0x0;
  _Stack_60.super__Rb_tree_header._M_node_count = 0;
  _Stack_60.super__Rb_tree_header._M_header._M_right =
       _Stack_60.super__Rb_tree_header._M_header._M_left;
  DAIAlg<libDAI::RegionGraph>::DAIAlg(&this->super_DAIAlgRG,(RegionGraph *)local_1d0,opts);
  RegionGraph::~RegionGraph((RegionGraph *)local_1d0);
  (this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_005e81c8;
  *(undefined8 *)&this->Props = 0;
  (this->Props).verbose = 0;
  (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_logZ = 0.0;
  bVar2 = initProps(this);
  if (!bVar2) {
    pEVar8 = (Exception *)__cxa_allocate_exception(0x10);
    local_1d0._0_8_ = this_00;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"jtree.cpp, line 52","");
    Exception::Exception(pEVar8,8,(string *)local_1d0);
    __cxa_throw(pEVar8,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                    ((long *)CONCAT44(extraout_var,iVar4));
  if (cVar3 == '\0') {
    pEVar8 = (Exception *)__cxa_allocate_exception(0x10);
    local_1d0._0_8_ = this_00;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"jtree.cpp, line 55","");
    Exception::Exception(pEVar8,10,(string *)local_1d0);
    __cxa_throw(pEVar8,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  if (automatic) {
    local_278.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar9 = 0;
    while( true ) {
      iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x48))
                        ((long *)CONCAT44(extraout_var_00,iVar4));
      if (uVar5 <= uVar9) break;
      iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      __x = (value_type *)
            (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x50))
                      ((long *)CONCAT44(extraout_var_01,iVar4),uVar9);
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::push_back(&local_278,__x);
      uVar9 = uVar9 + 1;
    }
    ClusterGraph::ClusterGraph((ClusterGraph *)local_1d0,&local_278);
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
    if (2 < CONCAT44(extraout_var_02,iVar4)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Initial clusters: ",0x12);
      poVar6 = libDAI::operator<<((ostream *)&std::cout,(ClusterGraph *)local_1d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    ClusterGraph::eraseNonMaximal((ClusterGraph *)local_1d0);
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
    if (2 < CONCAT44(extraout_var_03,iVar4)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Maximal clusters: ",0x12);
      poVar6 = libDAI::operator<<((ostream *)&std::cout,(ClusterGraph *)local_1d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    ClusterGraph::VarElim_MinFill(&local_260,(ClusterGraph *)local_1d0);
    pCVar7 = ClusterGraph::eraseNonMaximal(&local_260);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::vector
              (&local_290,&(pCVar7->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._nb2);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._nb1);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._E12ind);
    if (local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._E12.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._E12.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._E12.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._E12.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector
              (&local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._V2);
    if (local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._V1.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._V1.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._V1.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_260.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>._V1.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
    if (2 < CONCAT44(extraout_var_04,iVar4)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"VarElim_MinFill result: {",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
      if (local_290.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_290.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar9 = 0;
        do {
          if (uVar9 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
          }
          pVVar1 = local_290.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          n = local_290.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9]._vars.
              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
              super__Vector_impl_data._M_start;
          if (n != local_290.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar9]._vars.
                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
            do {
              libDAI::operator<<((ostream *)&std::cout,n);
              n = n + 1;
            } while (n != pVVar1[uVar9]._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_finish);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)((long)local_290.
                                       super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_290.
                                       super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
    }
    GenerateJT(this,&local_290);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(&local_290);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(local_158);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_170);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_188);
    if (local_1a0 != (pointer)0x0) {
      operator_delete(local_1a0,(long)local_190 - (long)local_1a0);
    }
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector
              ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)(local_1d0 + 0x18));
    if ((pointer)local_1d0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ - local_1d0._0_8_);
    }
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(&local_278);
  }
  return;
}

Assistant:

JTree::JTree( const FactorGraph &fg, const Properties &opts, bool automatic ) : DAIAlgRG(fg, opts), Props(), _RTree(), _Qa(), _Qb(), _mes(), _logZ() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        if( !grm().isConnected() ) 
           DAI_THROW(FACTORGRAPH_NOT_CONNECTED); 

        if( automatic ) {
            // Create ClusterGraph which contains factors as clusters
            vector<VarSet> cl;
            for( size_t I = 0; I < grm().nrFactors(); I++ )
                cl.push_back( grm().factor(I).vars() );
            ClusterGraph _cg(cl);

            if( Verbose() >= 3 ) {
                cout << "Initial clusters: " << _cg << endl;
            }

            // Retain only maximal clusters
            _cg.eraseNonMaximal();
            if( Verbose() >= 3 )
                cout << "Maximal clusters: " << _cg << endl;

            vector<VarSet> ElimVec = _cg.VarElim_MinFill().eraseNonMaximal().toVector();
            if( Verbose() >= 3 ) {
                cout << "VarElim_MinFill result: {" << endl;
                for( size_t i = 0; i < ElimVec.size(); i++ ) {
                    if( i != 0 )
                        cout << ", ";
                    cout << ElimVec[i];
                }
                cout << "}" << endl;
            }

            GenerateJT( ElimVec );
        }
    }